

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_ES_VERSION_3_1(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_ES_VERSION_3_1 != 0) {
    glad_glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)(*load)("glDispatchCompute");
    glad_glDispatchComputeIndirect =
         (PFNGLDISPATCHCOMPUTEINDIRECTPROC)(*load)("glDispatchComputeIndirect");
    glad_glDrawArraysIndirect = (PFNGLDRAWARRAYSINDIRECTPROC)(*load)("glDrawArraysIndirect");
    glad_glDrawElementsIndirect = (PFNGLDRAWELEMENTSINDIRECTPROC)(*load)("glDrawElementsIndirect");
    glad_glFramebufferParameteri =
         (PFNGLFRAMEBUFFERPARAMETERIPROC)(*load)("glFramebufferParameteri");
    glad_glGetFramebufferParameteriv =
         (PFNGLGETFRAMEBUFFERPARAMETERIVPROC)(*load)("glGetFramebufferParameteriv");
    glad_glGetProgramInterfaceiv =
         (PFNGLGETPROGRAMINTERFACEIVPROC)(*load)("glGetProgramInterfaceiv");
    glad_glGetProgramResourceIndex =
         (PFNGLGETPROGRAMRESOURCEINDEXPROC)(*load)("glGetProgramResourceIndex");
    glad_glGetProgramResourceName =
         (PFNGLGETPROGRAMRESOURCENAMEPROC)(*load)("glGetProgramResourceName");
    glad_glGetProgramResourceiv = (PFNGLGETPROGRAMRESOURCEIVPROC)(*load)("glGetProgramResourceiv");
    glad_glGetProgramResourceLocation =
         (PFNGLGETPROGRAMRESOURCELOCATIONPROC)(*load)("glGetProgramResourceLocation");
    glad_glUseProgramStages = (PFNGLUSEPROGRAMSTAGESPROC)(*load)("glUseProgramStages");
    glad_glActiveShaderProgram = (PFNGLACTIVESHADERPROGRAMPROC)(*load)("glActiveShaderProgram");
    glad_glCreateShaderProgramv = (PFNGLCREATESHADERPROGRAMVPROC)(*load)("glCreateShaderProgramv");
    glad_glBindProgramPipeline = (PFNGLBINDPROGRAMPIPELINEPROC)(*load)("glBindProgramPipeline");
    glad_glDeleteProgramPipelines =
         (PFNGLDELETEPROGRAMPIPELINESPROC)(*load)("glDeleteProgramPipelines");
    glad_glGenProgramPipelines = (PFNGLGENPROGRAMPIPELINESPROC)(*load)("glGenProgramPipelines");
    glad_glIsProgramPipeline = (PFNGLISPROGRAMPIPELINEPROC)(*load)("glIsProgramPipeline");
    glad_glGetProgramPipelineiv = (PFNGLGETPROGRAMPIPELINEIVPROC)(*load)("glGetProgramPipelineiv");
    glad_glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)(*load)("glProgramUniform1i");
    glad_glProgramUniform2i = (PFNGLPROGRAMUNIFORM2IPROC)(*load)("glProgramUniform2i");
    glad_glProgramUniform3i = (PFNGLPROGRAMUNIFORM3IPROC)(*load)("glProgramUniform3i");
    glad_glProgramUniform4i = (PFNGLPROGRAMUNIFORM4IPROC)(*load)("glProgramUniform4i");
    glad_glProgramUniform1ui = (PFNGLPROGRAMUNIFORM1UIPROC)(*load)("glProgramUniform1ui");
    glad_glProgramUniform2ui = (PFNGLPROGRAMUNIFORM2UIPROC)(*load)("glProgramUniform2ui");
    glad_glProgramUniform3ui = (PFNGLPROGRAMUNIFORM3UIPROC)(*load)("glProgramUniform3ui");
    glad_glProgramUniform4ui = (PFNGLPROGRAMUNIFORM4UIPROC)(*load)("glProgramUniform4ui");
    glad_glProgramUniform1f = (PFNGLPROGRAMUNIFORM1FPROC)(*load)("glProgramUniform1f");
    glad_glProgramUniform2f = (PFNGLPROGRAMUNIFORM2FPROC)(*load)("glProgramUniform2f");
    glad_glProgramUniform3f = (PFNGLPROGRAMUNIFORM3FPROC)(*load)("glProgramUniform3f");
    glad_glProgramUniform4f = (PFNGLPROGRAMUNIFORM4FPROC)(*load)("glProgramUniform4f");
    glad_glProgramUniform1iv = (PFNGLPROGRAMUNIFORM1IVPROC)(*load)("glProgramUniform1iv");
    glad_glProgramUniform2iv = (PFNGLPROGRAMUNIFORM2IVPROC)(*load)("glProgramUniform2iv");
    glad_glProgramUniform3iv = (PFNGLPROGRAMUNIFORM3IVPROC)(*load)("glProgramUniform3iv");
    glad_glProgramUniform4iv = (PFNGLPROGRAMUNIFORM4IVPROC)(*load)("glProgramUniform4iv");
    glad_glProgramUniform1uiv = (PFNGLPROGRAMUNIFORM1UIVPROC)(*load)("glProgramUniform1uiv");
    glad_glProgramUniform2uiv = (PFNGLPROGRAMUNIFORM2UIVPROC)(*load)("glProgramUniform2uiv");
    glad_glProgramUniform3uiv = (PFNGLPROGRAMUNIFORM3UIVPROC)(*load)("glProgramUniform3uiv");
    glad_glProgramUniform4uiv = (PFNGLPROGRAMUNIFORM4UIVPROC)(*load)("glProgramUniform4uiv");
    glad_glProgramUniform1fv = (PFNGLPROGRAMUNIFORM1FVPROC)(*load)("glProgramUniform1fv");
    glad_glProgramUniform2fv = (PFNGLPROGRAMUNIFORM2FVPROC)(*load)("glProgramUniform2fv");
    glad_glProgramUniform3fv = (PFNGLPROGRAMUNIFORM3FVPROC)(*load)("glProgramUniform3fv");
    glad_glProgramUniform4fv = (PFNGLPROGRAMUNIFORM4FVPROC)(*load)("glProgramUniform4fv");
    glad_glProgramUniformMatrix2fv =
         (PFNGLPROGRAMUNIFORMMATRIX2FVPROC)(*load)("glProgramUniformMatrix2fv");
    glad_glProgramUniformMatrix3fv =
         (PFNGLPROGRAMUNIFORMMATRIX3FVPROC)(*load)("glProgramUniformMatrix3fv");
    glad_glProgramUniformMatrix4fv =
         (PFNGLPROGRAMUNIFORMMATRIX4FVPROC)(*load)("glProgramUniformMatrix4fv");
    glad_glProgramUniformMatrix2x3fv =
         (PFNGLPROGRAMUNIFORMMATRIX2X3FVPROC)(*load)("glProgramUniformMatrix2x3fv");
    glad_glProgramUniformMatrix3x2fv =
         (PFNGLPROGRAMUNIFORMMATRIX3X2FVPROC)(*load)("glProgramUniformMatrix3x2fv");
    glad_glProgramUniformMatrix2x4fv =
         (PFNGLPROGRAMUNIFORMMATRIX2X4FVPROC)(*load)("glProgramUniformMatrix2x4fv");
    glad_glProgramUniformMatrix4x2fv =
         (PFNGLPROGRAMUNIFORMMATRIX4X2FVPROC)(*load)("glProgramUniformMatrix4x2fv");
    glad_glProgramUniformMatrix3x4fv =
         (PFNGLPROGRAMUNIFORMMATRIX3X4FVPROC)(*load)("glProgramUniformMatrix3x4fv");
    glad_glProgramUniformMatrix4x3fv =
         (PFNGLPROGRAMUNIFORMMATRIX4X3FVPROC)(*load)("glProgramUniformMatrix4x3fv");
    glad_glValidateProgramPipeline =
         (PFNGLVALIDATEPROGRAMPIPELINEPROC)(*load)("glValidateProgramPipeline");
    glad_glGetProgramPipelineInfoLog =
         (PFNGLGETPROGRAMPIPELINEINFOLOGPROC)(*load)("glGetProgramPipelineInfoLog");
    glad_glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)(*load)("glBindImageTexture");
    glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)(*load)("glGetBooleani_v");
    glad_glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)(*load)("glMemoryBarrier");
    glad_glMemoryBarrierByRegion =
         (PFNGLMEMORYBARRIERBYREGIONPROC)(*load)("glMemoryBarrierByRegion");
    glad_glTexStorage2DMultisample =
         (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)(*load)("glTexStorage2DMultisample");
    glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)(*load)("glGetMultisamplefv");
    glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)(*load)("glSampleMaski");
    glad_glGetTexLevelParameteriv =
         (PFNGLGETTEXLEVELPARAMETERIVPROC)(*load)("glGetTexLevelParameteriv");
    glad_glGetTexLevelParameterfv =
         (PFNGLGETTEXLEVELPARAMETERFVPROC)(*load)("glGetTexLevelParameterfv");
    glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)(*load)("glBindVertexBuffer");
    glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)(*load)("glVertexAttribFormat");
    glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)(*load)("glVertexAttribIFormat");
    glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)(*load)("glVertexAttribBinding");
    glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)(*load)("glVertexBindingDivisor");
  }
  return;
}

Assistant:

static void load_GL_ES_VERSION_3_1(GLADloadproc load) {
	if(!GLAD_GL_ES_VERSION_3_1) return;
	glad_glDispatchCompute = (PFNGLDISPATCHCOMPUTEPROC)load("glDispatchCompute");
	glad_glDispatchComputeIndirect = (PFNGLDISPATCHCOMPUTEINDIRECTPROC)load("glDispatchComputeIndirect");
	glad_glDrawArraysIndirect = (PFNGLDRAWARRAYSINDIRECTPROC)load("glDrawArraysIndirect");
	glad_glDrawElementsIndirect = (PFNGLDRAWELEMENTSINDIRECTPROC)load("glDrawElementsIndirect");
	glad_glFramebufferParameteri = (PFNGLFRAMEBUFFERPARAMETERIPROC)load("glFramebufferParameteri");
	glad_glGetFramebufferParameteriv = (PFNGLGETFRAMEBUFFERPARAMETERIVPROC)load("glGetFramebufferParameteriv");
	glad_glGetProgramInterfaceiv = (PFNGLGETPROGRAMINTERFACEIVPROC)load("glGetProgramInterfaceiv");
	glad_glGetProgramResourceIndex = (PFNGLGETPROGRAMRESOURCEINDEXPROC)load("glGetProgramResourceIndex");
	glad_glGetProgramResourceName = (PFNGLGETPROGRAMRESOURCENAMEPROC)load("glGetProgramResourceName");
	glad_glGetProgramResourceiv = (PFNGLGETPROGRAMRESOURCEIVPROC)load("glGetProgramResourceiv");
	glad_glGetProgramResourceLocation = (PFNGLGETPROGRAMRESOURCELOCATIONPROC)load("glGetProgramResourceLocation");
	glad_glUseProgramStages = (PFNGLUSEPROGRAMSTAGESPROC)load("glUseProgramStages");
	glad_glActiveShaderProgram = (PFNGLACTIVESHADERPROGRAMPROC)load("glActiveShaderProgram");
	glad_glCreateShaderProgramv = (PFNGLCREATESHADERPROGRAMVPROC)load("glCreateShaderProgramv");
	glad_glBindProgramPipeline = (PFNGLBINDPROGRAMPIPELINEPROC)load("glBindProgramPipeline");
	glad_glDeleteProgramPipelines = (PFNGLDELETEPROGRAMPIPELINESPROC)load("glDeleteProgramPipelines");
	glad_glGenProgramPipelines = (PFNGLGENPROGRAMPIPELINESPROC)load("glGenProgramPipelines");
	glad_glIsProgramPipeline = (PFNGLISPROGRAMPIPELINEPROC)load("glIsProgramPipeline");
	glad_glGetProgramPipelineiv = (PFNGLGETPROGRAMPIPELINEIVPROC)load("glGetProgramPipelineiv");
	glad_glProgramUniform1i = (PFNGLPROGRAMUNIFORM1IPROC)load("glProgramUniform1i");
	glad_glProgramUniform2i = (PFNGLPROGRAMUNIFORM2IPROC)load("glProgramUniform2i");
	glad_glProgramUniform3i = (PFNGLPROGRAMUNIFORM3IPROC)load("glProgramUniform3i");
	glad_glProgramUniform4i = (PFNGLPROGRAMUNIFORM4IPROC)load("glProgramUniform4i");
	glad_glProgramUniform1ui = (PFNGLPROGRAMUNIFORM1UIPROC)load("glProgramUniform1ui");
	glad_glProgramUniform2ui = (PFNGLPROGRAMUNIFORM2UIPROC)load("glProgramUniform2ui");
	glad_glProgramUniform3ui = (PFNGLPROGRAMUNIFORM3UIPROC)load("glProgramUniform3ui");
	glad_glProgramUniform4ui = (PFNGLPROGRAMUNIFORM4UIPROC)load("glProgramUniform4ui");
	glad_glProgramUniform1f = (PFNGLPROGRAMUNIFORM1FPROC)load("glProgramUniform1f");
	glad_glProgramUniform2f = (PFNGLPROGRAMUNIFORM2FPROC)load("glProgramUniform2f");
	glad_glProgramUniform3f = (PFNGLPROGRAMUNIFORM3FPROC)load("glProgramUniform3f");
	glad_glProgramUniform4f = (PFNGLPROGRAMUNIFORM4FPROC)load("glProgramUniform4f");
	glad_glProgramUniform1iv = (PFNGLPROGRAMUNIFORM1IVPROC)load("glProgramUniform1iv");
	glad_glProgramUniform2iv = (PFNGLPROGRAMUNIFORM2IVPROC)load("glProgramUniform2iv");
	glad_glProgramUniform3iv = (PFNGLPROGRAMUNIFORM3IVPROC)load("glProgramUniform3iv");
	glad_glProgramUniform4iv = (PFNGLPROGRAMUNIFORM4IVPROC)load("glProgramUniform4iv");
	glad_glProgramUniform1uiv = (PFNGLPROGRAMUNIFORM1UIVPROC)load("glProgramUniform1uiv");
	glad_glProgramUniform2uiv = (PFNGLPROGRAMUNIFORM2UIVPROC)load("glProgramUniform2uiv");
	glad_glProgramUniform3uiv = (PFNGLPROGRAMUNIFORM3UIVPROC)load("glProgramUniform3uiv");
	glad_glProgramUniform4uiv = (PFNGLPROGRAMUNIFORM4UIVPROC)load("glProgramUniform4uiv");
	glad_glProgramUniform1fv = (PFNGLPROGRAMUNIFORM1FVPROC)load("glProgramUniform1fv");
	glad_glProgramUniform2fv = (PFNGLPROGRAMUNIFORM2FVPROC)load("glProgramUniform2fv");
	glad_glProgramUniform3fv = (PFNGLPROGRAMUNIFORM3FVPROC)load("glProgramUniform3fv");
	glad_glProgramUniform4fv = (PFNGLPROGRAMUNIFORM4FVPROC)load("glProgramUniform4fv");
	glad_glProgramUniformMatrix2fv = (PFNGLPROGRAMUNIFORMMATRIX2FVPROC)load("glProgramUniformMatrix2fv");
	glad_glProgramUniformMatrix3fv = (PFNGLPROGRAMUNIFORMMATRIX3FVPROC)load("glProgramUniformMatrix3fv");
	glad_glProgramUniformMatrix4fv = (PFNGLPROGRAMUNIFORMMATRIX4FVPROC)load("glProgramUniformMatrix4fv");
	glad_glProgramUniformMatrix2x3fv = (PFNGLPROGRAMUNIFORMMATRIX2X3FVPROC)load("glProgramUniformMatrix2x3fv");
	glad_glProgramUniformMatrix3x2fv = (PFNGLPROGRAMUNIFORMMATRIX3X2FVPROC)load("glProgramUniformMatrix3x2fv");
	glad_glProgramUniformMatrix2x4fv = (PFNGLPROGRAMUNIFORMMATRIX2X4FVPROC)load("glProgramUniformMatrix2x4fv");
	glad_glProgramUniformMatrix4x2fv = (PFNGLPROGRAMUNIFORMMATRIX4X2FVPROC)load("glProgramUniformMatrix4x2fv");
	glad_glProgramUniformMatrix3x4fv = (PFNGLPROGRAMUNIFORMMATRIX3X4FVPROC)load("glProgramUniformMatrix3x4fv");
	glad_glProgramUniformMatrix4x3fv = (PFNGLPROGRAMUNIFORMMATRIX4X3FVPROC)load("glProgramUniformMatrix4x3fv");
	glad_glValidateProgramPipeline = (PFNGLVALIDATEPROGRAMPIPELINEPROC)load("glValidateProgramPipeline");
	glad_glGetProgramPipelineInfoLog = (PFNGLGETPROGRAMPIPELINEINFOLOGPROC)load("glGetProgramPipelineInfoLog");
	glad_glBindImageTexture = (PFNGLBINDIMAGETEXTUREPROC)load("glBindImageTexture");
	glad_glGetBooleani_v = (PFNGLGETBOOLEANI_VPROC)load("glGetBooleani_v");
	glad_glMemoryBarrier = (PFNGLMEMORYBARRIERPROC)load("glMemoryBarrier");
	glad_glMemoryBarrierByRegion = (PFNGLMEMORYBARRIERBYREGIONPROC)load("glMemoryBarrierByRegion");
	glad_glTexStorage2DMultisample = (PFNGLTEXSTORAGE2DMULTISAMPLEPROC)load("glTexStorage2DMultisample");
	glad_glGetMultisamplefv = (PFNGLGETMULTISAMPLEFVPROC)load("glGetMultisamplefv");
	glad_glSampleMaski = (PFNGLSAMPLEMASKIPROC)load("glSampleMaski");
	glad_glGetTexLevelParameteriv = (PFNGLGETTEXLEVELPARAMETERIVPROC)load("glGetTexLevelParameteriv");
	glad_glGetTexLevelParameterfv = (PFNGLGETTEXLEVELPARAMETERFVPROC)load("glGetTexLevelParameterfv");
	glad_glBindVertexBuffer = (PFNGLBINDVERTEXBUFFERPROC)load("glBindVertexBuffer");
	glad_glVertexAttribFormat = (PFNGLVERTEXATTRIBFORMATPROC)load("glVertexAttribFormat");
	glad_glVertexAttribIFormat = (PFNGLVERTEXATTRIBIFORMATPROC)load("glVertexAttribIFormat");
	glad_glVertexAttribBinding = (PFNGLVERTEXATTRIBBINDINGPROC)load("glVertexAttribBinding");
	glad_glVertexBindingDivisor = (PFNGLVERTEXBINDINGDIVISORPROC)load("glVertexBindingDivisor");
}